

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O0

bool __thiscall
Js::DeserializationCloner<Js::StreamReader>::TryClonePrimitive
          (DeserializationCloner<Js::StreamReader> *this,SrcTypeId typeId,Src src,Dst *dst)

{
  bool bVar1;
  Engine *this_00;
  RecyclableObject *pRVar2;
  JavascriptBoolean *pJVar3;
  _func_int **pp_Var4;
  unsigned_long local_70;
  unsigned_long n_2;
  long n_1;
  double dbl;
  int32 n;
  scaposition_t pos;
  JavascriptLibrary *lib;
  ScriptContext *scriptContext;
  Dst *dst_local;
  Src src_local;
  SrcTypeId typeId_local;
  DeserializationCloner<Js::StreamReader> *this_local;
  JavascriptLibrary *local_20;
  int32 local_14;
  _func_int **local_10;
  
  if ((int)typeId < 0xb) {
    scriptContext = (ScriptContext *)dst;
    dst_local._0_4_ = src;
    dst_local._4_4_ = typeId;
    _src_local = this;
    lib = (JavascriptLibrary *)ScriptContextHolder::GetScriptContext((ScriptContextHolder *)this);
    _n = ScriptContext::GetLibrary((ScriptContext *)lib);
    switch(dst_local._4_4_) {
    case SCA_None:
      (scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = (_func_int **)0x0;
      break;
    case SCA_Reference:
      StreamReader::Read<unsigned_int>(this->m_reader,(uint *)((long)&dbl + 4));
      this_00 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                ::GetEngine(&this->
                             super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                           );
      bVar1 = SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::
              TryGetClonedObject(this_00,dbl._4_4_,(void **)scriptContext);
      if (!bVar1) {
        ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
      }
      break;
    case SCA_NullValue:
      pRVar2 = JavascriptLibraryBase::GetNull(&_n->super_JavascriptLibraryBase);
      (scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = (_func_int **)pRVar2;
      break;
    case SCA_UndefinedValue:
      pRVar2 = JavascriptLibraryBase::GetUndefined(&_n->super_JavascriptLibraryBase);
      (scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = (_func_int **)pRVar2;
      break;
    case SCA_TrueValue:
      pJVar3 = JavascriptLibraryBase::GetTrue(&_n->super_JavascriptLibraryBase);
      (scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = (_func_int **)pJVar3;
      break;
    case SCA_FalseValue:
      pJVar3 = JavascriptLibraryBase::GetFalse(&_n->super_JavascriptLibraryBase);
      (scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = (_func_int **)pJVar3;
      break;
    case SCA_Int32Value:
      StreamReader::Read<int>(this->m_reader,(int *)&dbl);
      local_14 = dbl._0_4_;
      local_20 = lib;
      bVar1 = TaggedInt::IsOverflow(dbl._0_4_);
      if (bVar1) {
        local_10 = (_func_int **)
                   JavascriptNumber::NewInlined((double)local_14,(ScriptContext *)local_20);
      }
      else {
        local_10 = (_func_int **)TaggedInt::ToVarUnchecked(local_14);
      }
      (scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = local_10;
      break;
    case SCA_DoubleValue:
      StreamReader::Read<double>(this->m_reader,(double *)&n_1);
      pp_Var4 = (_func_int **)JavascriptNumber::ToVarWithCheck((double)n_1,(ScriptContext *)lib);
      (scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = pp_Var4;
      break;
    default:
      return false;
    case SCA_Int64Value:
      StreamReader::Read<long>(this->m_reader,(long *)&n_2);
      pp_Var4 = (_func_int **)JavascriptTypedNumber<long>::ToVar(n_2,(ScriptContext *)lib);
      (scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = pp_Var4;
      break;
    case SCA_LastPrimitive:
      StreamReader::Read<unsigned_long>(this->m_reader,&local_70);
      pp_Var4 = (_func_int **)
                JavascriptTypedNumber<unsigned_long>::ToVar(local_70,(ScriptContext *)lib);
      (scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = pp_Var4;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DeserializationCloner<Reader>::TryClonePrimitive(SrcTypeId typeId, Src src, Dst* dst)
    {
        if (!IsSCAPrimitive(typeId))
        {
            return false;
        }

        ScriptContext* scriptContext = this->GetScriptContext();
        JavascriptLibrary* lib = scriptContext->GetLibrary();

        switch (typeId)
        {
        case SCA_None:
            *dst = NULL;
            break;

        case SCA_Reference: // Handle reference explictly as a primitive
            {
                scaposition_t pos;
                m_reader->Read(&pos);
                if (!this->GetEngine()->TryGetClonedObject(pos, dst))
                {
                    this->ThrowSCADataCorrupt();
                }
            }
            break;

        case SCA_NullValue:
            *dst = lib->GetNull();
            break;

        case SCA_UndefinedValue:
            *dst = lib->GetUndefined();
            break;

        case SCA_TrueValue:
            *dst = lib->GetTrue();
            break;

        case SCA_FalseValue:
            *dst = lib->GetFalse();
            break;

        case SCA_Int32Value:
            {
                int32 n;
                m_reader->Read(&n);
                *dst = JavascriptNumber::ToVar(n, scriptContext);
            }
            break;

        case SCA_DoubleValue:
            {
                double dbl;
                m_reader->Read(&dbl);
                *dst = JavascriptNumber::ToVarWithCheck(dbl, scriptContext);
            }
            break;

        case SCA_Int64Value:
            {
                __int64 n;
                m_reader->Read(&n);
                *dst = JavascriptInt64Number::ToVar(n, scriptContext);
            }
            break;

        case SCA_Uint64Value:
            {
                unsigned __int64 n;
                m_reader->Read(&n);
                *dst = JavascriptUInt64Number::ToVar(n, scriptContext);
            }
            break;

        default:
            return false; // Not a recognized primitive type
        }

        return true;
    }